

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

ssize_t __thiscall dtc::fdt::property::write(property *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  pointer this_00;
  size_type sVar3;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  output_writer *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_58;
  value_iterator e;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_40;
  value_iterator i;
  byte_buffer value_buffer;
  string_table *strings_local;
  output_writer *writer_local;
  property *this_local;
  
  this_01 = (output_writer *)CONCAT44(in_register_00000034,__fd);
  dtb::output_writer::write_token(this_01,FDT_PROP);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  local_40._M_current = (property_value *)begin(this);
  local_58._M_current = (property_value *)end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_58);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
              ::operator->(&local_40);
    property_value::push_to_buffer(this_00,(byte_buffer *)&i);
    __gnu_cxx::
    __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
    ::operator++(&local_40);
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  (*this_01->_vptr_output_writer[4])(this_01,sVar3 & 0xffffffff);
  (*this_01->_vptr_output_writer[1])(this_01,this);
  uVar2 = dtb::string_table::add_string((string_table *)__buf,&this->key);
  (*this_01->_vptr_output_writer[4])(this_01,(ulong)uVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_70,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  dtb::output_writer::write_data(this_01,&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  return extraout_RAX;
}

Assistant:

void
property::write(dtb::output_writer &writer, dtb::string_table &strings)
{
	writer.write_token(dtb::FDT_PROP);
	byte_buffer value_buffer;
	for (value_iterator i=begin(), e=end() ; i!=e ; ++i)
	{
		i->push_to_buffer(value_buffer);
	}
	writer.write_data((uint32_t)value_buffer.size());
	writer.write_comment(key);
	writer.write_data(strings.add_string(key));
	writer.write_data(value_buffer);
}